

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::PackageImportItemSyntax>
          (DeepCloneVisitor *this,PackageImportItemSyntax *node,BumpAllocator *alloc)

{
  PackageImportItemSyntax *pPVar1;
  Token local_50;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone(&node->package,alloc);
  local_40 = parsing::Token::deepClone(&node->doubleColon,alloc);
  local_50 = parsing::Token::deepClone(&node->item,alloc);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PackageImportItemSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_30,&local_40,&local_50);
  return &pPVar1->super_SyntaxNode;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }